

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::resolve(Tree *this)

{
  pfn_error p_Var1;
  ulong uVar2;
  NodeType_e NVar3;
  code *pcVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  refdata *prVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  NodeData *pNVar19;
  size_t sVar20;
  size_t after;
  csubstr *pcVar21;
  csubstr *pcVar22;
  size_t sVar23;
  NodeType NVar24;
  long lVar25;
  char *pcVar26;
  char *pcVar27;
  size_t sVar28;
  long lVar29;
  byte bVar30;
  csubstr cVar31;
  NodeType_e NStackY_590;
  char msg [38];
  char *pcStack_4e8;
  size_t local_4e0;
  char *pcStack_4c0;
  size_t local_4b8;
  char *pcStack_498;
  size_t local_490;
  char *pcStack_470;
  size_t local_468;
  char *pcStack_448;
  size_t local_440;
  char *pcStack_420;
  size_t local_418;
  char *pcStack_3f8;
  size_t local_3f0;
  char *pcStack_3d0;
  size_t local_3c8;
  char *pcStack_3a8;
  size_t local_3a0;
  char *pcStack_380;
  size_t local_378;
  ReferenceResolver rr;
  
  bVar30 = 0;
  if (this->m_size != 0) {
    detail::ReferenceResolver::ReferenceResolver(&rr,this);
    prVar15 = rr.refs.m_stack;
    sVar28 = 0xffffffffffffffff;
    lVar18 = rr.refs.m_size * 0x30;
    after = sVar28;
    for (lVar29 = 0; lVar18 != lVar29; lVar29 = lVar29 + 0x30) {
      if ((*(byte *)((long)&(prVar15->type).type + lVar29) & 0xc0) != 0) {
        sVar23 = *(size_t *)((long)&prVar15->parent_ref + lVar29);
        if (sVar23 == 0xffffffffffffffff) {
          pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
          if (((pNVar19->m_type).type & KEY) != NOTYPE) {
            pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
            if (((pNVar19->m_type).type & KEYREF) != NOTYPE) {
              pcVar21 = key(this,*(size_t *)((long)&prVar15->node + lVar29));
              iVar17 = basic_substring<const_char>::compare(pcVar21,"<<",2);
              if (iVar17 == 0) {
                pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
                if ((~(int)(pNVar19->m_type).type & 3U) != 0) {
                  builtin_strncpy(msg,"check failed: (is_keyval(rd.node))",0x23);
                  if (((byte)s_error_flags & 1) != 0) {
                    bVar16 = is_debugger_attached();
                    if (bVar16) {
                      pcVar4 = (code *)swi(3);
                      (*pcVar4)();
                      return;
                    }
                  }
                  p_Var1 = (this->m_callbacks).m_error;
                  cVar31 = to_csubstr(
                                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                     );
                  local_3a0 = cVar31.len;
                  pcStack_3a8 = cVar31.str;
                  LVar10.super_LineCol.col = 0;
                  LVar10.super_LineCol.offset = SUB168(ZEXT816(0x673a) << 0x40,0);
                  LVar10.super_LineCol.line = SUB168(ZEXT816(0x673a) << 0x40,8);
                  LVar10.name.str = pcStack_3a8;
                  LVar10.name.len = local_3a0;
                  (*p_Var1)(msg,0x23,LVar10,(this->m_callbacks).m_user_data);
                }
                sVar23 = parent(this,*(size_t *)((long)&prVar15->node + lVar29));
                sVar20 = prev_sibling(this,*(size_t *)((long)&prVar15->node + lVar29));
                duplicate_children_no_rep
                          (this,*(size_t *)((long)&prVar15->target + lVar29),sVar23,sVar20);
                remove(this,*(char **)((long)&prVar15->node + lVar29));
                goto LAB_001bcb96;
              }
            }
          }
          uVar2 = *(ulong *)((long)&(prVar15->type).type + lVar29);
          if ((uVar2 & 0x40) == 0) {
            if (-1 < (char)uVar2) {
              builtin_strncpy(msg,"check failed: (rd.type.is_val_ref())",0x25);
              if (((byte)s_error_flags & 1) != 0) {
                bVar16 = is_debugger_attached();
                if (bVar16) {
                  pcVar4 = (code *)swi(3);
                  (*pcVar4)();
                  return;
                }
              }
              p_Var1 = (this->m_callbacks).m_error;
              cVar31 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_490 = cVar31.len;
              pcStack_498 = cVar31.str;
              LVar6.super_LineCol.col = 0;
              LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6754) << 0x40,0);
              LVar6.super_LineCol.line = SUB168(ZEXT816(0x6754) << 0x40,8);
              LVar6.name.str = pcStack_498;
              LVar6.name.len = local_490;
              (*p_Var1)(msg,0x25,LVar6,(this->m_callbacks).m_user_data);
            }
            pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
            if ((~(int)(pNVar19->m_type).type & 0x102U) == 0) {
              pcVar21 = key_anchor(this,*(size_t *)((long)&prVar15->target + lVar29));
              pcVar22 = val_ref(this,*(size_t *)((long)&prVar15->node + lVar29));
              iVar17 = basic_substring<const_char>::compare(pcVar21,pcVar22->str,pcVar22->len);
              if (iVar17 == 0) {
                pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
                if (((pNVar19->m_type).type & (STREAM|MAP)) != NOTYPE) {
                  builtin_strncpy(msg,"check failed: !is_container(rd.target)",0x26);
                  if (((byte)s_error_flags & 1) != 0) {
                    bVar16 = is_debugger_attached();
                    if (bVar16) {
                      pcVar4 = (code *)swi(3);
                      (*pcVar4)();
                      return;
                    }
                  }
                  p_Var1 = (this->m_callbacks).m_error;
                  cVar31 = to_csubstr(
                                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                     );
                  local_4b8 = cVar31.len;
                  pcStack_4c0 = cVar31.str;
                  LVar11.super_LineCol.col = 0;
                  LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6757) << 0x40,0);
                  LVar11.super_LineCol.line = SUB168(ZEXT816(0x6757) << 0x40,8);
                  LVar11.name.str = pcStack_4c0;
                  LVar11.name.len = local_4b8;
                  (*p_Var1)(msg,0x27,LVar11,(this->m_callbacks).m_user_data);
                }
                pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
                if (((pNVar19->m_type).type & VAL) == NOTYPE) {
                  builtin_strncpy(msg + 0x10,"s_val(rd.target)",0x11);
                  builtin_strncpy(msg,"check failed: ha",0x10);
                  if (((byte)s_error_flags & 1) != 0) {
                    bVar16 = is_debugger_attached();
                    if (bVar16) {
                      pcVar4 = (code *)swi(3);
                      (*pcVar4)();
                      return;
                    }
                  }
                  p_Var1 = (this->m_callbacks).m_error;
                  cVar31 = to_csubstr(
                                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                     );
                  local_4e0 = cVar31.len;
                  pcStack_4e8 = cVar31.str;
                  LVar12.super_LineCol.col = 0;
                  LVar12.super_LineCol.offset = SUB168(ZEXT816(0x6758) << 0x40,0);
                  LVar12.super_LineCol.line = SUB168(ZEXT816(0x6758) << 0x40,8);
                  LVar12.name.str = pcStack_4e8;
                  LVar12.name.len = local_4e0;
                  (*p_Var1)(msg,0x21,LVar12,(this->m_callbacks).m_user_data);
                }
                pcVar21 = key(this,*(size_t *)((long)&prVar15->target + lVar29));
                pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
                sVar23 = pcVar21->len;
                (pNVar19->m_val).scalar.str = pcVar21->str;
                (pNVar19->m_val).scalar.len = sVar23;
                goto LAB_001bcb86;
              }
            }
            duplicate_contents(this,*(size_t *)((long)&prVar15->target + lVar29),
                               *(size_t *)((long)&prVar15->node + lVar29));
          }
          else {
            pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
            if (((pNVar19->m_type).type & KEYREF) == NOTYPE) {
              builtin_strncpy(msg,"check failed: (is_key_ref(rd.node))",0x24);
              if (((byte)s_error_flags & 1) != 0) {
                bVar16 = is_debugger_attached();
                if (bVar16) {
                  pcVar4 = (code *)swi(3);
                  (*pcVar4)();
                  return;
                }
              }
              p_Var1 = (this->m_callbacks).m_error;
              cVar31 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_3c8 = cVar31.len;
              pcStack_3d0 = cVar31.str;
              LVar7.super_LineCol.col = 0;
              LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6742) << 0x40,0);
              LVar7.super_LineCol.line = SUB168(ZEXT816(0x6742) << 0x40,8);
              LVar7.name.str = pcStack_3d0;
              LVar7.name.len = local_3c8;
              (*p_Var1)(msg,0x24,LVar7,(this->m_callbacks).m_user_data);
            }
            pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
            if ((~(int)(pNVar19->m_type).type & 0x102U) != 0) {
              pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
              NVar3 = (pNVar19->m_type).type;
              if (((byte)(NVar3 >> 9) & (NVar3 & (SEQ|MAP|VAL)) != NOTYPE) == 0) {
                pcVar26 = "check failed: (has_key_anchor(rd.target) || has_val_anchor(rd.target))";
                pcVar27 = msg;
                for (lVar25 = 0x47; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *pcVar27 = *pcVar26;
                  pcVar26 = pcVar26 + (ulong)bVar30 * -2 + 1;
                  pcVar27 = pcVar27 + (ulong)bVar30 * -2 + 1;
                }
                if (((byte)s_error_flags & 1) != 0) {
                  bVar16 = is_debugger_attached();
                  if (bVar16) {
                    pcVar4 = (code *)swi(3);
                    (*pcVar4)();
                    return;
                  }
                }
                p_Var1 = (this->m_callbacks).m_error;
                cVar31 = to_csubstr(
                                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                   );
                local_3f0 = cVar31.len;
                pcStack_3f8 = cVar31.str;
                LVar8.super_LineCol.col = 0;
                LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6743) << 0x40,0);
                LVar8.super_LineCol.line = SUB168(ZEXT816(0x6743) << 0x40,8);
                LVar8.name.str = pcStack_3f8;
                LVar8.name.len = local_3f0;
                (*p_Var1)(msg,0x47,LVar8,(this->m_callbacks).m_user_data);
              }
            }
            pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
            NVar3 = (pNVar19->m_type).type;
            if ((NVar3 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar3 >> 9 & 1) == 0) {
LAB_001bca76:
              pcVar21 = key_anchor(this,*(size_t *)((long)&prVar15->target + lVar29));
              pcVar22 = key_ref(this,*(size_t *)((long)&prVar15->node + lVar29));
              iVar17 = basic_substring<const_char>::compare(pcVar21,pcVar22->str,pcVar22->len);
              if (iVar17 != 0) {
                builtin_strncpy(msg + 0x10,"y_anchor(rd.target) ==",0x16);
                builtin_strncpy(msg,"check failed: ke",0x10);
                if (((byte)s_error_flags & 1) != 0) {
                  bVar16 = is_debugger_attached();
                  if (bVar16) {
                    pcVar4 = (code *)swi(3);
                    (*pcVar4)();
                    return;
                  }
                }
                p_Var1 = (this->m_callbacks).m_error;
                cVar31 = to_csubstr(
                                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                   );
                local_468 = cVar31.len;
                pcStack_470 = cVar31.str;
                LVar9.super_LineCol.col = 0;
                LVar9.super_LineCol.offset = SUB168(ZEXT816(0x674d) << 0x40,0);
                LVar9.super_LineCol.line = SUB168(ZEXT816(0x674d) << 0x40,8);
                LVar9.name.str = pcStack_470;
                LVar9.name.len = local_468;
                (*p_Var1)(msg,0x38,LVar9,(this->m_callbacks).m_user_data);
              }
              pcVar21 = key(this,*(size_t *)((long)&prVar15->target + lVar29));
              pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
              sVar23 = pcVar21->len;
              (pNVar19->m_key).scalar.str = pcVar21->str;
              (pNVar19->m_key).scalar.len = sVar23;
LAB_001bcb86:
              NStackY_590 = VAL;
            }
            else {
              pcVar21 = val_anchor(this,*(size_t *)((long)&prVar15->target + lVar29));
              pcVar22 = key_ref(this,*(size_t *)((long)&prVar15->node + lVar29));
              iVar17 = basic_substring<const_char>::compare(pcVar21,pcVar22->str,pcVar22->len);
              if (iVar17 != 0) goto LAB_001bca76;
              pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
              if (((pNVar19->m_type).type & (STREAM|MAP)) != NOTYPE) {
                builtin_strncpy(msg,"check failed: !is_container(rd.target)",0x26);
                if (((byte)s_error_flags & 1) != 0) {
                  bVar16 = is_debugger_attached();
                  if (bVar16) {
                    pcVar4 = (code *)swi(3);
                    (*pcVar4)();
                    return;
                  }
                }
                p_Var1 = (this->m_callbacks).m_error;
                cVar31 = to_csubstr(
                                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                   );
                local_418 = cVar31.len;
                pcStack_420 = cVar31.str;
                LVar13.super_LineCol.col = 0;
                LVar13.super_LineCol.offset = SUB168(ZEXT816(0x6746) << 0x40,0);
                LVar13.super_LineCol.line = SUB168(ZEXT816(0x6746) << 0x40,8);
                LVar13.name.str = pcStack_420;
                LVar13.name.len = local_418;
                (*p_Var1)(msg,0x27,LVar13,(this->m_callbacks).m_user_data);
              }
              pNVar19 = _p(this,*(size_t *)((long)&prVar15->target + lVar29));
              if (((pNVar19->m_type).type & VAL) == NOTYPE) {
                builtin_strncpy(msg + 0x10,"s_val(rd.target)",0x11);
                builtin_strncpy(msg,"check failed: ha",0x10);
                if (((byte)s_error_flags & 1) != 0) {
                  bVar16 = is_debugger_attached();
                  if (bVar16) {
                    pcVar4 = (code *)swi(3);
                    (*pcVar4)();
                    return;
                  }
                }
                p_Var1 = (this->m_callbacks).m_error;
                cVar31 = to_csubstr(
                                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                   );
                local_440 = cVar31.len;
                pcStack_448 = cVar31.str;
                LVar14.super_LineCol.col = 0;
                LVar14.super_LineCol.offset = SUB168(ZEXT816(0x6747) << 0x40,0);
                LVar14.super_LineCol.line = SUB168(ZEXT816(0x6747) << 0x40,8);
                LVar14.name.str = pcStack_448;
                LVar14.name.len = local_440;
                (*p_Var1)(msg,0x21,LVar14,(this->m_callbacks).m_user_data);
              }
              pcVar21 = val(this,*(size_t *)((long)&prVar15->target + lVar29));
              pNVar19 = _p(this,*(size_t *)((long)&prVar15->node + lVar29));
              sVar23 = pcVar21->len;
              (pNVar19->m_key).scalar.str = pcVar21->str;
              (pNVar19->m_key).scalar.len = sVar23;
              NStackY_590 = KEY;
            }
            _add_flags(this,*(size_t *)((long)&prVar15->node + lVar29),NStackY_590);
          }
        }
        else {
          pNVar19 = _p(this,sVar23);
          if (((pNVar19->m_type).type & SEQ) == NOTYPE) {
            builtin_strncpy(msg,"check failed: (is_seq(rd.parent_ref))",0x26);
            if (((byte)s_error_flags & 1) != 0) {
              bVar16 = is_debugger_attached();
              if (bVar16) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
            }
            p_Var1 = (this->m_callbacks).m_error;
            cVar31 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_378 = cVar31.len;
            pcStack_380 = cVar31.str;
            LVar5.super_LineCol.col = 0;
            LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6727) << 0x40,0);
            LVar5.super_LineCol.line = SUB168(ZEXT816(0x6727) << 0x40,8);
            LVar5.name.str = pcStack_380;
            LVar5.name.len = local_378;
            (*p_Var1)(msg,0x26,LVar5,(this->m_callbacks).m_user_data);
          }
          sVar20 = parent(this,*(size_t *)((long)&prVar15->parent_ref + lVar29));
          sVar23 = *(size_t *)((long)&prVar15->parent_ref + lVar29);
          if (sVar28 != sVar23) {
            after = sVar23;
          }
          after = duplicate_children_no_rep
                            (this,*(size_t *)((long)&prVar15->target + lVar29),sVar20,after);
          remove(this,*(char **)((long)&prVar15->node + lVar29));
          sVar28 = sVar23;
        }
      }
LAB_001bcb96:
    }
    for (lVar18 = 0; rr.refs.m_size * 0x30 - lVar18 != 0; lVar18 = lVar18 + 0x30) {
      rem_anchor_ref(this,*(size_t *)((long)&(rr.refs.m_stack)->node + lVar18));
      sVar28 = *(size_t *)((long)&(rr.refs.m_stack)->parent_ref + lVar18);
      if (sVar28 != 0xffffffffffffffff) {
        NVar24 = type(this,sVar28);
        if (NVar24.type != NOTYPE) {
          remove(this,*(char **)((long)&(rr.refs.m_stack)->parent_ref + lVar18));
        }
      }
    }
    detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::~stack(&rr.refs);
  }
  return;
}

Assistant:

void Tree::resolve()
{
    if(m_size == 0)
        return;

    detail::ReferenceResolver rr(this);

    // insert the resolved references
    size_t prev_parent_ref = NONE;
    size_t prev_parent_ref_after = NONE;
    for(auto const& C4_RESTRICT rd : rr.refs)
    {
        if( ! rd.type.is_ref())
            continue;
        if(rd.parent_ref != NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_seq(rd.parent_ref));
            size_t after, p = parent(rd.parent_ref);
            if(prev_parent_ref != rd.parent_ref)
            {
                after = rd.parent_ref;//prev_sibling(rd.parent_ref_sibling);
                prev_parent_ref_after = after;
            }
            else
            {
                after = prev_parent_ref_after;
            }
            prev_parent_ref = rd.parent_ref;
            prev_parent_ref_after = duplicate_children_no_rep(rd.target, p, after);
            remove(rd.node);
        }
        else
        {
            if(has_key(rd.node) && is_key_ref(rd.node) && key(rd.node) == "<<")
            {
                _RYML_CB_ASSERT(m_callbacks, is_keyval(rd.node));
                size_t p = parent(rd.node);
                size_t after = prev_sibling(rd.node);
                duplicate_children_no_rep(rd.target, p, after);
                remove(rd.node);
            }
            else if(rd.type.is_key_ref())
            {
                _RYML_CB_ASSERT(m_callbacks, is_key_ref(rd.node));
                _RYML_CB_ASSERT(m_callbacks, has_key_anchor(rd.target) || has_val_anchor(rd.target));
                if(has_val_anchor(rd.target) && val_anchor(rd.target) == key_ref(rd.node))
                {
                    _RYML_CB_CHECK(m_callbacks, !is_container(rd.target));
                    _RYML_CB_CHECK(m_callbacks, has_val(rd.target));
                    _p(rd.node)->m_key.scalar = val(rd.target);
                    _add_flags(rd.node, KEY);
                }
                else
                {
                    _RYML_CB_CHECK(m_callbacks, key_anchor(rd.target) == key_ref(rd.node));
                    _p(rd.node)->m_key.scalar = key(rd.target);
                    _add_flags(rd.node, VAL);
                }
            }
            else
            {
                _RYML_CB_ASSERT(m_callbacks, rd.type.is_val_ref());
                if(has_key_anchor(rd.target) && key_anchor(rd.target) == val_ref(rd.node))
                {
                    _RYML_CB_CHECK(m_callbacks, !is_container(rd.target));
                    _RYML_CB_CHECK(m_callbacks, has_val(rd.target));
                    _p(rd.node)->m_val.scalar = key(rd.target);
                    _add_flags(rd.node, VAL);
                }
                else
                {
                    duplicate_contents(rd.target, rd.node);
                }
            }
        }
    }

    // clear anchors and refs
    for(auto const& C4_RESTRICT ar : rr.refs)
    {
        rem_anchor_ref(ar.node);
        if(ar.parent_ref != NONE)
            if(type(ar.parent_ref) != NOTYPE)
                remove(ar.parent_ref);
    }

}